

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HopcroftKarpAlgorithm.cpp
# Opt level: O0

bool __thiscall BoxNesting::HopcroftKarpAlgorithm::dfs(HopcroftKarpAlgorithm *this,int16_t vertex)

{
  short sVar1;
  bool bVar2;
  const_reference pvVar3;
  reference psVar4;
  reference pvVar5;
  short in_SI;
  vector<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
  *in_RDI;
  short j;
  const_iterator __end1;
  const_iterator __begin1;
  value_type *__range1;
  undefined4 in_stack_ffffffffffffffa8;
  undefined2 in_stack_ffffffffffffffac;
  undefined2 in_stack_ffffffffffffffae;
  short sVar6;
  pointer *in_stack_ffffffffffffffb0;
  __normal_iterator<const_short_*,_std::vector<short,_std::allocator<short>_>_> local_28;
  undefined6 in_stack_ffffffffffffffe8;
  value_type vVar7;
  bool local_1;
  
  if (in_SI == 0) {
    local_1 = true;
  }
  else {
    pvVar3 = std::
             vector<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
             ::operator[](in_RDI,(long)in_SI);
    local_28._M_current =
         (short *)std::vector<short,_std::allocator<short>_>::begin
                            ((vector<short,_std::allocator<short>_> *)
                             CONCAT26(in_stack_ffffffffffffffae,
                                      CONCAT24(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8))
                            );
    std::vector<short,_std::allocator<short>_>::end
              ((vector<short,_std::allocator<short>_> *)
               CONCAT26(in_stack_ffffffffffffffae,
                        CONCAT24(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)));
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_short_*,_std::vector<short,_std::allocator<short>_>_>
                               *)in_stack_ffffffffffffffb0,
                              (__normal_iterator<const_short_*,_std::vector<short,_std::allocator<short>_>_>
                               *)CONCAT26(in_stack_ffffffffffffffae,
                                          CONCAT24(in_stack_ffffffffffffffac,
                                                   in_stack_ffffffffffffffa8))), bVar2) {
      psVar4 = __gnu_cxx::
               __normal_iterator<const_short_*,_std::vector<short,_std::allocator<short>_>_>::
               operator*(&local_28);
      sVar6 = *psVar4;
      in_stack_ffffffffffffffb0 =
           &in_RDI[3].
            super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
      pvVar5 = std::vector<short,_std::allocator<short>_>::operator[]
                         ((vector<short,_std::allocator<short>_> *)
                          &in_RDI[2].
                           super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,(long)sVar6);
      pvVar5 = std::vector<short,_std::allocator<short>_>::operator[]
                         ((vector<short,_std::allocator<short>_> *)in_stack_ffffffffffffffb0,
                          (long)*pvVar5);
      sVar1 = *pvVar5;
      pvVar5 = std::vector<short,_std::allocator<short>_>::operator[]
                         ((vector<short,_std::allocator<short>_> *)
                          &in_RDI[3].
                           super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,(long)in_SI);
      if ((int)sVar1 == *pvVar5 + 1) {
        std::vector<short,_std::allocator<short>_>::operator[]
                  ((vector<short,_std::allocator<short>_> *)
                   &in_RDI[2].
                    super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,(long)sVar6);
        bVar2 = dfs((HopcroftKarpAlgorithm *)CONCAT26(in_SI,in_stack_ffffffffffffffe8),
                    (int16_t)((ulong)pvVar3 >> 0x30));
        if (bVar2) {
          vVar7 = in_SI;
          pvVar5 = std::vector<short,_std::allocator<short>_>::operator[]
                             ((vector<short,_std::allocator<short>_> *)
                              &in_RDI[2].
                               super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish,(long)sVar6);
          *pvVar5 = in_SI;
          pvVar5 = std::vector<short,_std::allocator<short>_>::operator[]
                             ((vector<short,_std::allocator<short>_> *)
                              &in_RDI[1].
                               super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish,(long)vVar7);
          *pvVar5 = sVar6;
          return true;
        }
      }
      __gnu_cxx::__normal_iterator<const_short_*,_std::vector<short,_std::allocator<short>_>_>::
      operator++(&local_28);
    }
    pvVar5 = std::vector<short,_std::allocator<short>_>::operator[]
                       ((vector<short,_std::allocator<short>_> *)
                        &in_RDI[3].
                         super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,(long)in_SI);
    *pvVar5 = 0x7fff;
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool HopcroftKarpAlgorithm::dfs(int16_t vertex) const
{
	// Path ends if it visits the NILL vertex
	// because we can't traverse anywhere from it
	// It is a shorter path because we we are allready
	// iterating through shorter paths.
	if (vertex == NILL)
	{
		return true;
	}

	for (auto j : this->graph[vertex])
	{ 
		// Follow the distances set by BFS 
		if (this->distances[this->pairsRight[j]] == this->distances[vertex] + 1) 
		{ 
			// If dfs for pair of v also returns 
			// true then it means the path ends at a
			// NILL which means it is the shortest math
			if (dfs(this->pairsRight[j])) 
			{
				// At the matching
				this->pairsRight[j] = vertex;
				this->pairsLeft[vertex] = j;
				return true; 
			} 
		} 
	} 

	// We set distance to infinite here so we can ensure it will
	// not be used in a future path. We allready know this is not
	// the shortest path so it doesn't make sense to check this vertex
	// again.
	this->distances[vertex] = INF; 
	// No paths where found to NILL so it isn't
	// the shortest path
	return false; 
}